

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O2

int amqp_ssl_socket_set_cacert(amqp_socket_t *base,char *cacert)

{
  int iVar1;
  
  if (base->klass == &amqp_ssl_socket_class) {
    iVar1 = SSL_CTX_load_verify_locations((SSL_CTX *)base[1].klass,cacert,(char *)0x0);
    return (uint)(iVar1 == 1) * 0x200 + -0x200;
  }
  amqp_abort("<%p> is not of type amqp_ssl_socket_t",base);
}

Assistant:

int
amqp_ssl_socket_set_cacert(amqp_socket_t *base,
                           const char *cacert)
{
  int status;
  struct amqp_ssl_socket_t *self;
  if (base->klass != &amqp_ssl_socket_class) {
    amqp_abort("<%p> is not of type amqp_ssl_socket_t", base);
  }
  self = (struct amqp_ssl_socket_t *)base;
  status = SSL_CTX_load_verify_locations(self->ctx, cacert, NULL);
  if (1 != status) {
    return AMQP_STATUS_SSL_ERROR;
  }
  return AMQP_STATUS_OK;
}